

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DemoScripts.cpp
# Opt level: O0

void __thiscall
DemoScripts::TrainSpikingIris(DemoScripts *this,char *path,default_random_engine *generator)

{
  initializer_list<LayerMeta> __l;
  IDenseNetwork *this_00;
  size_type sVar1;
  reference sample;
  reference pvVar2;
  size_t sVar3;
  ostream *poVar4;
  pointer *this_01;
  vector<float,_std::allocator<float>_> *pvVar5;
  float fVar6;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float local_504;
  float local_484;
  LayerMeta *local_3c0;
  string local_370;
  int local_350;
  int local_34c;
  int local_348;
  int local_344;
  uint local_340;
  int local_33c;
  int guess;
  int predictedClassId;
  float local_31c;
  undefined1 local_318 [4];
  float loss;
  vector<float,_std::allocator<float>_> deltas;
  vector<float,_std::allocator<float>_> output;
  int sampleId;
  float viriginicaDelta;
  float versiDelta;
  float cetozaDelta;
  int virginicaCnt;
  int versiCnt;
  int cetozaCnt;
  int guesses;
  int silentSamples;
  float totalLoss;
  int epochId;
  undefined1 local_298 [8];
  SpikeTrainDataset data;
  Dataset rawData;
  IDenseNetwork *network;
  LayerMeta *local_1c0;
  LayerMeta local_1b8;
  undefined4 local_178 [2];
  string local_170 [32];
  undefined8 local_150;
  DenseLifLayerBuilder *local_148;
  undefined4 local_140;
  undefined4 local_13c;
  undefined4 local_138 [2];
  string local_130 [32];
  undefined8 local_110;
  DenseLifLayerBuilder *local_108;
  undefined4 local_100;
  undefined4 local_fc;
  iterator local_f8;
  size_type local_f0;
  undefined1 local_e8 [8];
  vector<LayerMeta,_std::allocator<LayerMeta>_> layersMeta;
  PreciseEventManager eventManager;
  ILayerBuilder local_98;
  DenseLifLayerBuilder layerBuilder;
  LifNeuronBuilder neuronBuilder;
  LifSynapseBuilder local_78 [8];
  LifSynapseBuilder synapseBuilder;
  undefined1 local_68 [8];
  vector<ILayer_*,_std::allocator<ILayer_*>_> layers;
  float LAMBDA;
  float BETA;
  float ALPHA;
  int BATCH_SIZE;
  size_t IRIS_OUTPUT;
  size_t IRIS_INPUT;
  float SIMULATION_TIME;
  float LEARNING_RATE_W;
  float LEARNING_RATE_V;
  float EPS;
  default_random_engine *generator_local;
  char *path_local;
  DemoScripts *this_local;
  
  layers.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0x41200000;
  layers.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x38d1b717;
  std::vector<ILayer_*,_std::allocator<ILayer_*>_>::vector
            ((vector<ILayer_*,_std::allocator<ILayer_*>_> *)local_68);
  LifSynapseBuilder::LifSynapseBuilder(local_78,(linear_congruential_engine *)generator);
  layerBuilder.super_ILayerBuilder._vptr_ILayerBuilder = (ILayerBuilder)(_func_int **)0x0;
  LifNeuronBuilder::LifNeuronBuilder((LifNeuronBuilder *)&layerBuilder);
  local_98._vptr_ILayerBuilder = (_func_int **)0x0;
  DenseLifLayerBuilder::DenseLifLayerBuilder((DenseLifLayerBuilder *)&local_98);
  PreciseEventManager::PreciseEventManager
            ((PreciseEventManager *)
             &layersMeta.super__Vector_base<LayerMeta,_std::allocator<LayerMeta>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  network._4_1_ = 1;
  local_1c0 = &local_1b8;
  local_1b8.alpha = 1.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b8.name,"input",(allocator *)((long)&network + 7));
  local_1b8.size = 4;
  local_1b8.neuronBuilder = (INeuronBuilder *)&layerBuilder;
  local_1b8.width = 1.0;
  local_1b8.zShift = 0.0;
  local_1c0 = (LayerMeta *)local_178;
  local_178[0] = 0x3f800000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"hidden2",(allocator *)((long)&network + 6));
  local_150 = 6;
  local_148 = &layerBuilder;
  local_140 = 0x40000000;
  local_13c = 0x3f800000;
  local_1c0 = (LayerMeta *)local_138;
  local_138[0] = 0x3f000000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"output",(allocator *)((long)&network + 5));
  local_110 = 3;
  local_108 = &layerBuilder;
  local_100 = 0x3f000000;
  local_fc = 0x3f800000;
  network._4_1_ = 0;
  local_f8 = &local_1b8;
  local_f0 = 3;
  std::allocator<LayerMeta>::allocator((allocator<LayerMeta> *)((long)&network + 3));
  __l._M_len = local_f0;
  __l._M_array = local_f8;
  std::vector<LayerMeta,_std::allocator<LayerMeta>_>::vector
            ((vector<LayerMeta,_std::allocator<LayerMeta>_> *)local_e8,__l,
             (allocator<LayerMeta> *)((long)&network + 3));
  std::allocator<LayerMeta>::~allocator((allocator<LayerMeta> *)((long)&network + 3));
  local_3c0 = (LayerMeta *)&local_f8;
  do {
    local_3c0 = local_3c0 + -1;
    LayerMeta::~LayerMeta(local_3c0);
  } while (local_3c0 != &local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&network + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&network + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&network + 7));
  this_00 = IDenseNetworkBuilder::Build
                      ((IDenseNetworkBuilder *)
                       ((long)&rawData.yTest.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 7),
                       (vector<LayerMeta,_std::allocator<LayerMeta>_> *)local_e8,
                       (ISynapseBuilder *)local_78,&local_98,
                       (IEventManager *)
                       &layersMeta.super__Vector_base<LayerMeta,_std::allocator<LayerMeta>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage,generator,0.0);
  SPIKING_NN::Dataset::Dataset
            (&data.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  SPIKING_NN::SpikeTrainDataset::SpikeTrainDataset(local_298);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&epochId,path,(allocator *)((long)&totalLoss + 3));
  IRIS::ReadIris((string *)&epochId,
                 (Dataset *)
                 &data.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,0.0);
  std::__cxx11::string::~string((string *)&epochId);
  std::allocator<char>::~allocator((allocator<char> *)((long)&totalLoss + 3));
  DATA_CONVERSION::ConvertDataToSpikeTrains
            ((Dataset *)
             &data.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(SpikeTrainDataset *)local_298,
             (linear_congruential_engine *)generator,200.0);
  for (silentSamples = 0; silentSamples < 100; silentSamples = silentSamples + 1) {
    guesses = 0;
    cetozaCnt = 0;
    versiCnt = 0;
    virginicaCnt = 0;
    cetozaDelta = 0.0;
    versiDelta = 0.0;
    viriginicaDelta = 0.0;
    sampleId = 0;
    output.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0.0;
    for (output.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._0_4_ = 0;
        sVar1 = std::
                vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                ::size((vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                        *)local_298),
        (ulong)(long)(int)output.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage < sVar1;
        output.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ =
             (int)output.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 1) {
      sample = std::
               vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                             *)local_298,
                            (long)(int)output.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage);
      IDenseNetwork::Forward
                ((vector<float,_std::allocator<float>_> *)
                 &deltas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,this_00,sample,200.0,false);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_318);
      IDenseNetwork::GetOutputNeurons
                ((vector<INeuron_*,_std::allocator<INeuron_*>_> *)&guess,this_00);
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &data.xTrain.
                           super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)(int)output.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage);
      fVar6 = NormedCustomLoss2((vector<INeuron_*,_std::allocator<INeuron_*>_> *)&guess,*pvVar2,
                                (vector<float,_std::allocator<float>_> *)local_318);
      std::vector<INeuron_*,_std::allocator<INeuron_*>_>::~vector
                ((vector<INeuron_*,_std::allocator<INeuron_*>_> *)&guess);
      guesses = (int)((float)guesses + fVar6);
      local_31c = fVar6;
      sVar3 = GetClassPrediction((vector<float,_std::allocator<float>_> *)
                                 &deltas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage);
      local_33c = (int)sVar3;
      cetozaCnt = cetozaCnt + (uint)(local_33c == -1);
      virginicaCnt = virginicaCnt + (uint)(local_33c == 0);
      cetozaDelta = (float)((int)cetozaDelta + (uint)(local_33c == 1));
      versiDelta = (float)((int)versiDelta + (uint)(local_33c == 2));
      this_01 = &data.xTrain.
                 super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::vector<float,_std::allocator<float>_>::operator[]
                ((vector<float,_std::allocator<float>_> *)this_01,
                 (long)(int)output.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
      std::abs((int)this_01);
      local_340 = (uint)(extraout_XMM0_Da < 0.1);
      versiCnt = versiCnt + local_340;
      pvVar5 = (vector<float,_std::allocator<float>_> *)local_318;
      std::vector<float,_std::allocator<float>_>::operator[](pvVar5,0);
      std::abs((int)pvVar5);
      viriginicaDelta = viriginicaDelta + extraout_XMM0_Da_00;
      pvVar5 = (vector<float,_std::allocator<float>_> *)local_318;
      std::vector<float,_std::allocator<float>_>::operator[](pvVar5,1);
      std::abs((int)pvVar5);
      sampleId = (int)((float)sampleId + extraout_XMM0_Da_01);
      pvVar5 = (vector<float,_std::allocator<float>_> *)local_318;
      std::vector<float,_std::allocator<float>_>::operator[](pvVar5,2);
      std::abs((int)pvVar5);
      output.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           output.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ + extraout_XMM0_Da_02;
      IDenseNetwork::Backward(this_00,(vector<float,_std::allocator<float>_> *)local_318);
      if (((int)output.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 1) % 1 == 0) {
        IDenseNetwork::GradStep(this_00,1,1e-06,1e-05,10.0,0.0001);
      }
      IDenseNetwork::Reset(this_00);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_318);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)
                 &deltas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"Loss for epoch: ");
    local_344 = (int)std::setw(3);
    poVar4 = std::operator<<(poVar4,(_Setw)local_344);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,silentSamples);
    std::operator<<(poVar4," is: ");
    poVar4 = (ostream *)std::ostream::operator<<(&std::cout,std::fixed);
    local_348 = (int)std::setprecision(5);
    poVar4 = std::operator<<(poVar4,(_Setprecision)local_348);
    local_34c = (int)std::setw(9);
    poVar4 = std::operator<<(poVar4,(_Setw)local_34c);
    sVar1 = std::
            vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
            ::size((vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                    *)local_298);
    local_484 = (float)sVar1;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(float)guesses / local_484);
    std::operator<<(poVar4," ");
    poVar4 = std::operator<<((ostream *)&std::cout,"Predictions: cetoza-");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,virginicaCnt);
    poVar4 = std::operator<<(poVar4," versi-");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)cetozaDelta);
    poVar4 = std::operator<<(poVar4," virginica-");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)versiDelta);
    std::operator<<(poVar4," ");
    poVar4 = std::operator<<((ostream *)&std::cout,"deltas: cetoza-");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,viriginicaDelta);
    poVar4 = std::operator<<(poVar4," versi-");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(float)sampleId);
    poVar4 = std::operator<<(poVar4," virginica-");
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (poVar4,output.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._4_4_);
    std::operator<<(poVar4," ");
    poVar4 = std::operator<<((ostream *)&std::cout,"Accuracy: ");
    sVar1 = std::
            vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
            ::size((vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                    *)local_298);
    local_504 = (float)sVar1;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(float)versiCnt / local_504);
    std::operator<<(poVar4," ");
    poVar4 = std::operator<<((ostream *)&std::cout,"Silent samples: ");
    local_350 = (int)std::setw(3);
    poVar4 = std::operator<<(poVar4,(_Setw)local_350);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,cetozaCnt);
    std::operator<<(poVar4," | ");
    IDenseNetwork::GetStringStats_abi_cxx11_(&local_370,this_00);
    std::operator<<((ostream *)&std::cout,(string *)&local_370);
    std::__cxx11::string::~string((string *)&local_370);
    IDenseNetwork::ResetStats(this_00);
  }
  if (this_00 != (IDenseNetwork *)0x0) {
    IDenseNetwork::~IDenseNetwork(this_00);
    operator_delete(this_00,0x30);
  }
  SPIKING_NN::SpikeTrainDataset::~SpikeTrainDataset(local_298);
  SPIKING_NN::Dataset::~Dataset
            (&data.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<LayerMeta,_std::allocator<LayerMeta>_>::~vector
            ((vector<LayerMeta,_std::allocator<LayerMeta>_> *)local_e8);
  PreciseEventManager::~PreciseEventManager
            ((PreciseEventManager *)
             &layersMeta.super__Vector_base<LayerMeta,_std::allocator<LayerMeta>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  LifSynapseBuilder::~LifSynapseBuilder(local_78);
  std::vector<ILayer_*,_std::allocator<ILayer_*>_>::~vector
            ((vector<ILayer_*,_std::allocator<ILayer_*>_> *)local_68);
  return;
}

Assistant:

void DemoScripts::TrainSpikingIris( char *path, std::default_random_engine &generator )
{
    float EPS = 1e-1;
    float LEARNING_RATE_V = 0.000001;
    float LEARNING_RATE_W = 0.00001;
    float SIMULATION_TIME = 200;

    size_t IRIS_INPUT = 4;
    size_t IRIS_OUTPUT = 3;

    int BATCH_SIZE = 1;

    const float ALPHA = 0.05;
    const float BETA = 10;
    const float LAMBDA = 0.0001;


    std::vector<ILayer *> layers;
    LifSynapseBuilder synapseBuilder = LifSynapseBuilder( generator );
    LifNeuronBuilder neuronBuilder = LifNeuronBuilder();
    DenseLifLayerBuilder layerBuilder = DenseLifLayerBuilder();
    PreciseEventManager eventManager = PreciseEventManager();


    std::vector<LayerMeta> layersMeta = {
            {1,   "input",   IRIS_INPUT,  neuronBuilder, 1,   0},
            {1,   "hidden2", 6,           neuronBuilder, 2,   1},
            {0.5, "output",  IRIS_OUTPUT, neuronBuilder, 0.5, 1}
    };

    auto network = IDenseNetworkBuilder().Build( layersMeta, synapseBuilder, layerBuilder, eventManager,
                                                 generator, 0 );

    SPIKING_NN::Dataset rawData;
    SPIKING_NN::SpikeTrainDataset data;
    IRIS::ReadIris( path, rawData, 0 );
    DATA_CONVERSION::ConvertDataToSpikeTrains( rawData, data, generator, SIMULATION_TIME );

    for ( int epochId = 0; epochId < 100; epochId++ ) {
        float totalLoss = 0.f;
        int silentSamples = 0;
        int guesses = 0;
        int cetozaCnt = 0;
        int versiCnt = 0;
        int virginicaCnt = 0;
        float cetozaDelta = 0;
        float versiDelta = 0;
        float viriginicaDelta = 0;

        for ( int sampleId = 0; sampleId < data.xTrain.size(); sampleId++ ) {
            std::vector<float> output = network->Forward( data.xTrain[sampleId], SIMULATION_TIME, false );

            std::vector<float> deltas;
            float loss = NormedCustomLoss2( network->GetOutputNeurons(), data.yTrain[sampleId], deltas );
            totalLoss += loss;
            int predictedClassId = GetClassPrediction( output );
            silentSamples += predictedClassId == -1 ? 1 : 0;
            cetozaCnt += predictedClassId == 0 ? 1 : 0;
            versiCnt += predictedClassId == 1 ? 1 : 0;
            virginicaCnt += predictedClassId == 2 ? 1 : 0;
            int guess = abs((float) predictedClassId - data.yTrain[sampleId] ) < EPS;
            guesses += guess;
            cetozaDelta += abs( deltas[0] );
            versiDelta += abs( deltas[1] );
            viriginicaDelta += abs( deltas[2] );

            network->Backward( deltas );

            if (( sampleId + 1 ) % BATCH_SIZE == 0 ) {
                network->GradStep( BATCH_SIZE, LEARNING_RATE_V, LEARNING_RATE_W, BETA, LAMBDA );
            }
            network->Reset();
        }
        std::cout << "Loss for epoch: " << std::setw( 3 ) << epochId << " is: ";
        std::cout << std::fixed << std::setprecision( 5 ) << std::setw( 9 ) << totalLoss / data.xTrain.size() << " ";
        std::cout << "Predictions: cetoza-" << cetozaCnt << " versi-" << versiCnt << " virginica-" << virginicaCnt
                  << " ";
        std::cout << "deltas: cetoza-" << cetozaDelta << " versi-" << versiDelta << " virginica-" << viriginicaDelta
                  << " ";
        std::cout << "Accuracy: " << (float) guesses / data.xTrain.size() << " ";
        std::cout << "Silent samples: " << std::setw( 3 ) << silentSamples << " | ";
        std::cout << network->GetStringStats();
        network->ResetStats();
    }
    delete network;
}